

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsysteminterface_p.h
# Opt level: O2

void __thiscall QWindowSystemInterfacePrivate::MouseEvent::~MouseEvent(MouseEvent *this)

{
  UserEvent::~UserEvent((UserEvent *)this);
  operator_delete(this,0x78);
  return;
}

Assistant:

MouseEvent(QWindow *w, ulong time, const QPointF &local, const QPointF &global,
                   Qt::MouseButtons state, Qt::KeyboardModifiers mods,
                   Qt::MouseButton b, QEvent::Type type,
                   Qt::MouseEventSource src = Qt::MouseEventNotSynthesized, bool frame = false,
                   const QPointingDevice *device = QPointingDevice::primaryPointingDevice(),
                   int evPtId = -1)
            : PointerEvent(w, time, Mouse, mods, device), localPos(local), globalPos(global),
              buttons(state), source(src), nonClientArea(frame), button(b), buttonType(type),
              eventPointId(evPtId) { }